

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# relaxng.c
# Opt level: O0

int xmlRelaxNGValidateElementEnd(xmlRelaxNGValidCtxtPtr ctxt,int dolog)

{
  xmlRelaxNGValidStatePtr pxVar1;
  xmlNodePtr pxVar2;
  xmlRelaxNGValidStatePtr state;
  int i;
  int dolog_local;
  xmlRelaxNGValidCtxtPtr ctxt_local;
  
  pxVar1 = ctxt->state;
  if (pxVar1->seq != (xmlNodePtr)0x0) {
    pxVar2 = xmlRelaxNGSkipIgnored(ctxt,pxVar1->seq);
    pxVar1->seq = pxVar2;
    if (pxVar1->seq != (xmlNodePtr)0x0) {
      if (dolog != 0) {
        xmlRelaxNGAddValidError
                  (ctxt,XML_RELAXNG_ERR_EXTRACONTENT,pxVar1->node->name,pxVar1->seq->name,0);
      }
      return -1;
    }
  }
  state._0_4_ = 0;
  while( true ) {
    if (pxVar1->nbAttrs <= (int)state) {
      return 0;
    }
    if (pxVar1->attrs[(int)state] != (xmlAttrPtr)0x0) break;
    state._0_4_ = (int)state + 1;
  }
  if (dolog != 0) {
    xmlRelaxNGAddValidError
              (ctxt,XML_RELAXNG_ERR_INVALIDATTR,pxVar1->attrs[(int)state]->name,pxVar1->node->name,0
              );
  }
  return -1 - (int)state;
}

Assistant:

static int
xmlRelaxNGValidateElementEnd(xmlRelaxNGValidCtxtPtr ctxt, int dolog)
{
    int i;
    xmlRelaxNGValidStatePtr state;

    state = ctxt->state;
    if (state->seq != NULL) {
        state->seq = xmlRelaxNGSkipIgnored(ctxt, state->seq);
        if (state->seq != NULL) {
            if (dolog) {
                VALID_ERR3(XML_RELAXNG_ERR_EXTRACONTENT,
                           state->node->name, state->seq->name);
            }
            return (-1);
        }
    }
    for (i = 0; i < state->nbAttrs; i++) {
        if (state->attrs[i] != NULL) {
            if (dolog) {
                VALID_ERR3(XML_RELAXNG_ERR_INVALIDATTR,
                           state->attrs[i]->name, state->node->name);
            }
            return (-1 - i);
        }
    }
    return (0);
}